

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectmodelbuilder.h
# Opt level: O2

string * string_trim(string *__return_storage_ptr__,string *input)

{
  int iVar1;
  char *pcVar2;
  long lVar3;
  long lVar4;
  
  if (input->_M_string_length == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    lVar3 = (long)((int)input->_M_string_length + -1);
    lVar4 = -1;
    do {
      lVar4 = lVar4 + 1;
      pcVar2 = (char *)std::__cxx11::string::at((ulong)input);
      iVar1 = isspace((int)*pcVar2);
      if (lVar3 <= lVar4) break;
    } while (iVar1 != 0);
    do {
      pcVar2 = (char *)std::__cxx11::string::at((ulong)input);
      iVar1 = isspace((int)*pcVar2);
      if (lVar3 <= lVar4) break;
      lVar3 = lVar3 + -1;
    } while (iVar1 != 0);
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)input);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string string_trim(const std::string &input)
{
    if (input.size() < 1)
        return std::string();
    int first = 0, last = input.size() - 1;
    while (std::isspace(input.at(first)) && first < last) ++first;
    while (std::isspace(input.at(last)) && first < last) --last;
    return input.substr(first, last+1);
}